

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O3

int run_test_spawn_fs_open(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  ssize_t sVar3;
  uv_buf_t *buf;
  anon_union_8_2_26168aa3_for_data unaff_RBX;
  uv_process_t *puVar4;
  uv_process_t *puVar5;
  code *req;
  uv_timer_t *puVar6;
  int fd;
  uv_stdio_container_t stdio [1];
  uv_pipe_t in;
  uv_fs_t fs_req;
  uv_write_t write_req;
  undefined1 auStack_518 [16];
  uint uStack_508;
  undefined4 uStack_500;
  undefined4 uStack_4f0;
  undefined1 auStack_4d8 [284];
  char local_3bc [4];
  uv_stdio_container_t local_3b8;
  uv_buf_t local_3a0;
  undefined1 local_390 [264];
  uv_fs_t local_288;
  uv_write_t local_d0;
  
  req = (code *)&local_288;
  auStack_4d8._264_8_ = 0x16bf71;
  local_3bc = (char  [4])uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)req,"/dev/null",2,0,(uv_fs_cb)0x0);
  if ((int)local_3bc < 0) {
    auStack_4d8._264_8_ = 0x16c0ce;
    run_test_spawn_fs_open_cold_1();
LAB_0016c0ce:
    auStack_4d8._264_8_ = 0x16c0d3;
    run_test_spawn_fs_open_cold_2();
LAB_0016c0d3:
    auStack_4d8._264_8_ = 0x16c0d8;
    run_test_spawn_fs_open_cold_3();
LAB_0016c0d8:
    auStack_4d8._264_8_ = 0x16c0dd;
    run_test_spawn_fs_open_cold_4();
LAB_0016c0dd:
    auStack_4d8._264_8_ = 0x16c0e2;
    run_test_spawn_fs_open_cold_5();
LAB_0016c0e2:
    auStack_4d8._264_8_ = 0x16c0e7;
    run_test_spawn_fs_open_cold_6();
LAB_0016c0e7:
    auStack_4d8._264_8_ = 0x16c0ec;
    run_test_spawn_fs_open_cold_7();
LAB_0016c0ec:
    auStack_4d8._264_8_ = 0x16c0f1;
    run_test_spawn_fs_open_cold_8();
  }
  else {
    auStack_4d8._264_8_ = 0x16bf8a;
    uv_fs_req_cleanup(&local_288);
    auStack_4d8._264_8_ = 0x16bf9d;
    init_process_options("spawn_helper8",exit_cb);
    auStack_4d8._264_8_ = 0x16bfa2;
    puVar2 = uv_default_loop();
    unaff_RBX.stream = (uv_stream_t *)local_390;
    auStack_4d8._264_8_ = 0x16bfb4;
    req = (code *)unaff_RBX.stream;
    iVar1 = uv_pipe_init(puVar2,(uv_pipe_t *)unaff_RBX.stream,0);
    if (iVar1 != 0) goto LAB_0016c0ce;
    options.stdio = &local_3b8;
    local_3b8.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
    options.stdio_count = 1;
    auStack_4d8._264_8_ = 0x16bfe8;
    local_3b8.data.stream = unaff_RBX.stream;
    puVar2 = uv_default_loop();
    puVar4 = &process;
    auStack_4d8._264_8_ = 0x16bffa;
    iVar1 = uv_spawn(puVar2,&process,&options);
    req = (code *)puVar4;
    if (iVar1 != 0) goto LAB_0016c0d3;
    auStack_4d8._264_8_ = 0x16c011;
    local_3a0 = uv_buf_init(local_3bc,4);
    req = (code *)local_390;
    auStack_4d8._264_8_ = 0x16c03e;
    iVar1 = uv_write(&local_d0,(uv_stream_t *)req,&local_3a0,1,write_cb);
    if (iVar1 != 0) goto LAB_0016c0d8;
    auStack_4d8._264_8_ = 0x16c04b;
    puVar2 = uv_default_loop();
    req = (code *)0x0;
    auStack_4d8._264_8_ = 0x16c055;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0016c0dd;
    req = (code *)&local_288;
    auStack_4d8._264_8_ = 0x16c072;
    iVar1 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)req,(uv_file)local_3bc,(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_0016c0e2;
    if (exit_cb_called != 1) goto LAB_0016c0e7;
    if (close_cb_called != 2) goto LAB_0016c0ec;
    auStack_4d8._264_8_ = 0x16c08d;
    unaff_RBX.stream = (uv_stream_t *)uv_default_loop();
    auStack_4d8._264_8_ = 0x16c0a1;
    uv_walk((uv_loop_t *)unaff_RBX.stream,close_walk_cb,(void *)0x0);
    req = (code *)0x0;
    auStack_4d8._264_8_ = 0x16c0ab;
    uv_run((uv_loop_t *)unaff_RBX.stream,UV_RUN_DEFAULT);
    auStack_4d8._264_8_ = 0x16c0b0;
    puVar2 = uv_default_loop();
    auStack_4d8._264_8_ = 0x16c0b8;
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  auStack_4d8._264_8_ = run_test_closed_fd_events;
  run_test_spawn_fs_open_cold_9();
  puVar4 = (uv_process_t *)auStack_518;
  auStack_4d8._264_8_ = unaff_RBX;
  iVar1 = pipe((int *)puVar4);
  if (iVar1 == 0) {
    init_process_options("spawn_helper4",exit_cb);
    options.stdio_count = 3;
    options.stdio = (uv_stdio_container_t *)(auStack_518 + 8);
    auStack_518._8_4_ = 2;
    uStack_508 = auStack_518._0_4_;
    uStack_500 = 0;
    uStack_4f0 = 0;
    puVar4 = (uv_process_t *)uv_default_loop();
    puVar5 = &process;
    iVar1 = uv_spawn((uv_loop_t *)puVar4,&process,&options);
    req = (code *)puVar5;
    if (iVar1 != 0) goto LAB_0016c33a;
    uv_unref((uv_handle_t *)&process);
    puVar4 = (uv_process_t *)uv_default_loop();
    req = (code *)auStack_4d8;
    iVar1 = uv_pipe_init((uv_loop_t *)puVar4,(uv_pipe_t *)req,0);
    if (iVar1 != 0) goto LAB_0016c33f;
    req._4_4_ = 0;
    req._0_4_ = auStack_518._0_4_;
    puVar4 = (uv_process_t *)auStack_4d8;
    iVar1 = uv_pipe_open((uv_pipe_t *)puVar4,auStack_518._0_4_);
    if (iVar1 != 0) goto LAB_0016c344;
    auStack_518._0_4_ = 0xffffffff;
    req = on_alloc;
    puVar4 = (uv_process_t *)auStack_4d8;
    iVar1 = uv_read_start((uv_stream_t *)puVar4,on_alloc,on_read_once);
    if (iVar1 != 0) goto LAB_0016c349;
    puVar4 = (uv_process_t *)(ulong)(uint)auStack_518._4_4_;
    req = (code *)0x1902f1;
    sVar3 = write(auStack_518._4_4_,"",1);
    if (sVar3 != 1) goto LAB_0016c34e;
    puVar4 = (uv_process_t *)uv_default_loop();
    req = (code *)0x1;
    iVar1 = uv_run((uv_loop_t *)puVar4,UV_RUN_ONCE);
    if (iVar1 != 0) goto LAB_0016c353;
    if (output_used != 1) goto LAB_0016c358;
    uv_close((uv_handle_t *)auStack_4d8,close_cb);
    puVar4 = (uv_process_t *)(ulong)(uint)auStack_518._4_4_;
    req = (code *)0x1902f1;
    sVar3 = write(auStack_518._4_4_,"",1);
    if (sVar3 != 1) goto LAB_0016c35d;
    puVar4 = (uv_process_t *)uv_default_loop();
    puVar6 = &timer;
    iVar1 = uv_timer_init((uv_loop_t *)puVar4,&timer);
    req = (code *)puVar6;
    if (iVar1 != 0) goto LAB_0016c362;
    puVar6 = &timer;
    req = timer_counter_cb;
    iVar1 = uv_timer_start(&timer,timer_counter_cb,10,0);
    puVar4 = (uv_process_t *)puVar6;
    if (iVar1 != 0) goto LAB_0016c367;
    puVar4 = (uv_process_t *)uv_default_loop();
    req = (code *)0x1;
    iVar1 = uv_run((uv_loop_t *)puVar4,UV_RUN_ONCE);
    if (iVar1 == 1) {
      puVar4 = (uv_process_t *)uv_default_loop();
      req = (code *)0x1;
      iVar1 = uv_run((uv_loop_t *)puVar4,UV_RUN_ONCE);
      if (iVar1 != 0) goto LAB_0016c380;
    }
    if (timer_counter != 1) goto LAB_0016c36c;
    puVar4 = &process;
    req = (code *)0xf;
    iVar1 = uv_process_kill(&process,0xf);
    if (iVar1 != 0) goto LAB_0016c371;
    puVar4 = (uv_process_t *)(ulong)(uint)auStack_518._4_4_;
    iVar1 = close(auStack_518._4_4_);
    if (iVar1 != 0) goto LAB_0016c376;
    puVar2 = uv_default_loop();
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    req = (code *)0x0;
    uv_run(puVar2,UV_RUN_DEFAULT);
    puVar4 = (uv_process_t *)uv_default_loop();
    iVar1 = uv_loop_close((uv_loop_t *)puVar4);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_closed_fd_events_cold_1();
LAB_0016c33a:
    run_test_closed_fd_events_cold_2();
LAB_0016c33f:
    run_test_closed_fd_events_cold_3();
LAB_0016c344:
    run_test_closed_fd_events_cold_4();
LAB_0016c349:
    run_test_closed_fd_events_cold_5();
LAB_0016c34e:
    run_test_closed_fd_events_cold_6();
LAB_0016c353:
    run_test_closed_fd_events_cold_7();
LAB_0016c358:
    run_test_closed_fd_events_cold_8();
LAB_0016c35d:
    run_test_closed_fd_events_cold_9();
LAB_0016c362:
    run_test_closed_fd_events_cold_10();
LAB_0016c367:
    run_test_closed_fd_events_cold_11();
LAB_0016c36c:
    run_test_closed_fd_events_cold_13();
LAB_0016c371:
    run_test_closed_fd_events_cold_14();
LAB_0016c376:
    run_test_closed_fd_events_cold_15();
  }
  run_test_closed_fd_events_cold_16();
LAB_0016c380:
  run_test_closed_fd_events_cold_12();
  uv_read_stop((uv_stream_t *)puVar4);
  on_read((uv_stream_t *)puVar4,(ssize_t)req,buf);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(spawn_fs_open) {
  int fd;
  uv_fs_t fs_req;
  uv_pipe_t in;
  uv_write_t write_req;
  uv_buf_t buf;
  uv_stdio_container_t stdio[1];

  fd = uv_fs_open(NULL, &fs_req, "/dev/null", O_RDWR, 0, NULL);
  ASSERT(fd >= 0);
  uv_fs_req_cleanup(&fs_req);

  init_process_options("spawn_helper8", exit_cb);

  ASSERT(0 == uv_pipe_init(uv_default_loop(), &in, 0));

  options.stdio = stdio;
  options.stdio[0].flags = UV_CREATE_PIPE | UV_READABLE_PIPE;
  options.stdio[0].data.stream = (uv_stream_t*) &in;
  options.stdio_count = 1;

  ASSERT(0 == uv_spawn(uv_default_loop(), &process, &options));

  buf = uv_buf_init((char*) &fd, sizeof(fd));
  ASSERT(0 == uv_write(&write_req, (uv_stream_t*) &in, &buf, 1, write_cb));

  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT(0 == uv_fs_close(NULL, &fs_req, fd, NULL));

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 2);  /* One for `in`, one for process */

  MAKE_VALGRIND_HAPPY();
  return 0;
}